

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O1

void nsync::waiter_destroy(void *v)

{
  uint attempts;
  long *in_FS_OFFSET;
  
  *(undefined8 *)(*in_FS_OFFSET + -8) = 0;
  if ((*(uint *)((long)v + 0x188) & 3) != 1) {
    _DAT_00000000 = 0;
  }
  *(uint *)((long)v + 0x188) = *(uint *)((long)v + 0x188) & 0xfffffffe;
  attempts = 0;
  while ((free_waiters_mu & 1) != 0) {
    attempts = nsync_spin_delay_(attempts);
  }
  free_waiters_mu = free_waiters_mu | 1;
  LOCK();
  UNLOCK();
  free_waiters = nsync_dll_make_first_in_list_(free_waiters,(nsync_dll_element_ *)((long)v + 0x110))
  ;
  free_waiters_mu = 0;
  return;
}

Assistant:

static void waiter_destroy (void *v) {
	waiter *w = (waiter *) v;
	/* Reset waiter_for_thread in case another thread-local variable reuses
	   the waiter in its destructor while the waiter is taken by the other
	   thread from free_waiters. This can happen as the destruction order
	   of thread-local variables can be arbitrary in some platform e.g.
	   POSIX.  */
	waiter_for_thread = NULL;
	IGNORE_RACES_START ();
	ASSERT ((w->flags & (WAITER_RESERVED|WAITER_IN_USE)) == WAITER_RESERVED);
	w->flags &= ~WAITER_RESERVED;
	nsync_spin_test_and_set_ (&free_waiters_mu, 1, 1, 0);
	free_waiters = nsync_dll_make_first_in_list_ (free_waiters, &w->nw.q);
	ATM_STORE_REL (&free_waiters_mu, 0); /* release store */
	IGNORE_RACES_END ();
}